

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O1

box3f * __thiscall pbrt::Object::getBounds(box3f *__return_storage_ptr__,Object *this)

{
  mutex *__mutex;
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  pointer psVar10;
  pointer psVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar15;
  undefined8 uVar16;
  shared_ptr<pbrt::Instance> *inst;
  pointer psVar17;
  pointer psVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  box3f ib;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  if (this->haveComputedBounds == true) {
    fVar1 = (this->bounds).upper.z;
    (__return_storage_ptr__->upper).y = (this->bounds).upper.y;
    (__return_storage_ptr__->upper).z = fVar1;
    fVar1 = (this->bounds).lower.y;
    uVar16 = *(undefined8 *)&(this->bounds).lower.z;
    (__return_storage_ptr__->lower).x = (this->bounds).lower.x;
    (__return_storage_ptr__->lower).y = fVar1;
    *(undefined8 *)&(__return_storage_ptr__->lower).z = uVar16;
  }
  else {
    __mutex = &this->mutex;
    iVar15 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar15 != 0) {
      uVar16 = std::__throw_system_error(iVar15);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      _Unwind_Resume(uVar16);
    }
    if (this->haveComputedBounds == false) {
      (this->bounds).lower.x = 3.4028235e+38;
      (this->bounds).lower.y = 3.4028235e+38;
      *(undefined8 *)&(this->bounds).lower.z = 0xff7fffff7f7fffff;
      (this->bounds).upper.y = -3.4028235e+38;
      (this->bounds).upper.z = -3.4028235e+38;
      psVar10 = (this->instances).
                super__Vector_base<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar17 = (this->instances).
                     super__Vector_base<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; psVar17 != psVar10;
          psVar17 = psVar17 + 1) {
        if (((((psVar17->super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
               (element_type *)0x0) &&
             ((*(((psVar17->super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                ->super_Entity)._vptr_Entity[3])(&local_48), local_48 <= local_3c)) &&
            (local_44 <= local_38)) && (local_40 <= local_34)) {
          auVar21._4_4_ = local_44;
          auVar21._0_4_ = local_48;
          auVar21._8_8_ = 0;
          uVar2 = (this->bounds).lower.x;
          uVar6 = (this->bounds).lower.y;
          auVar22._4_4_ = uVar6;
          auVar22._0_4_ = uVar2;
          auVar22._8_8_ = 0;
          auVar22 = minps(auVar21,auVar22);
          uVar3 = (this->bounds).upper.x;
          uVar7 = (this->bounds).upper.y;
          auVar12._4_4_ = uVar7;
          auVar12._0_4_ = uVar3;
          fVar1 = (this->bounds).lower.z;
          fVar24 = local_40;
          if (fVar1 <= local_40) {
            fVar24 = fVar1;
          }
          (this->bounds).lower.x = (float)(int)auVar22._0_8_;
          (this->bounds).lower.y = (float)(int)((ulong)auVar22._0_8_ >> 0x20);
          (this->bounds).lower.z = fVar24;
          auVar19._4_4_ = local_38;
          auVar19._0_4_ = local_3c;
          auVar19._8_8_ = 0;
          auVar12._8_8_ = 0;
          auVar22 = maxps(auVar19,auVar12);
          fVar1 = (this->bounds).upper.z;
          fVar24 = local_34;
          if (local_34 <= fVar1) {
            fVar24 = fVar1;
          }
          (this->bounds).upper.x = (float)(int)auVar22._0_8_;
          (this->bounds).upper.y = (float)(int)((ulong)auVar22._0_8_ >> 0x20);
          (this->bounds).upper.z = fVar24;
        }
      }
      psVar11 = (this->shapes).
                super__Vector_base<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar18 = (this->shapes).
                     super__Vector_base<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; psVar18 != psVar11;
          psVar18 = psVar18 + 1) {
        if ((((psVar18->super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
              (element_type *)0x0) &&
            ((*(((psVar18->super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
               super_Entity)._vptr_Entity[6])(&local_48), local_48 <= local_3c)) &&
           ((local_44 <= local_38 && (local_40 <= local_34)))) {
          auVar23._4_4_ = local_44;
          auVar23._0_4_ = local_48;
          auVar23._8_8_ = 0;
          uVar4 = (this->bounds).lower.x;
          uVar8 = (this->bounds).lower.y;
          auVar13._4_4_ = uVar8;
          auVar13._0_4_ = uVar4;
          auVar13._8_8_ = 0;
          auVar22 = minps(auVar23,auVar13);
          uVar5 = (this->bounds).upper.x;
          uVar9 = (this->bounds).upper.y;
          auVar14._4_4_ = uVar9;
          auVar14._0_4_ = uVar5;
          fVar1 = (this->bounds).lower.z;
          fVar24 = local_40;
          if (fVar1 <= local_40) {
            fVar24 = fVar1;
          }
          (this->bounds).lower.x = (float)(int)auVar22._0_8_;
          (this->bounds).lower.y = (float)(int)((ulong)auVar22._0_8_ >> 0x20);
          (this->bounds).lower.z = fVar24;
          auVar20._4_4_ = local_38;
          auVar20._0_4_ = local_3c;
          auVar20._8_8_ = 0;
          auVar14._8_8_ = 0;
          auVar22 = maxps(auVar20,auVar14);
          fVar1 = (this->bounds).upper.z;
          fVar24 = local_34;
          if (local_34 <= fVar1) {
            fVar24 = fVar1;
          }
          (this->bounds).upper.x = (float)(int)auVar22._0_8_;
          (this->bounds).upper.y = (float)(int)((ulong)auVar22._0_8_ >> 0x20);
          (this->bounds).upper.z = fVar24;
        }
      }
      this->haveComputedBounds = true;
    }
    fVar1 = (this->bounds).upper.z;
    (__return_storage_ptr__->upper).y = (this->bounds).upper.y;
    (__return_storage_ptr__->upper).z = fVar1;
    fVar1 = (this->bounds).lower.y;
    uVar16 = *(undefined8 *)&(this->bounds).lower.z;
    (__return_storage_ptr__->lower).x = (this->bounds).lower.x;
    (__return_storage_ptr__->lower).y = fVar1;
    *(undefined8 *)&(__return_storage_ptr__->lower).z = uVar16;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  return __return_storage_ptr__;
}

Assistant:

box3f Object::getBounds() 
  {
    if (haveComputedBounds) return bounds;

    std::lock_guard<std::mutex> lock(mutex);
    if (haveComputedBounds) return bounds;
    
    bounds = box3f::empty_box();
    for (auto &inst : instances) {
      if (inst) {
        const box3f ib = inst->getBounds();
        if (!ib.empty())
          bounds.extend(ib);
      }
    }
    for (auto &geom : shapes) {
      if (geom) {
        const box3f gb = geom->getBounds();
        if (!gb.empty())
          bounds.extend(gb);
      }
    }
    haveComputedBounds = true;
    return bounds;
  }